

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O0

void __thiscall PointPseudoLog::test_method(PointPseudoLog *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_430;
  double local_410;
  NegativeReturnType local_408;
  assertion_result local_3f8;
  basic_cstring<const_char> local_3e0;
  basic_cstring<const_char> local_3d0;
  Matrix<double,__1,_1,_0,__1,_1> local_3c0;
  undefined1 local_3b0 [8];
  Vector3d res;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_390;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_368;
  Ref local_340 [8];
  Point y;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_218;
  Ref local_1f0 [8];
  Point x;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  undefined1 local_a0 [8];
  Vector3d v;
  RealSpace R3;
  PointPseudoLog *this_local;
  
  mnf::RealSpace::RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),3);
  local_a8 = 1.0;
  local_b0 = 2.0;
  local_b8 = 3.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_a0,&local_a8,&local_b0,&local_b8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_218,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0,(type *)0x0);
  mnf::Manifold::createPoint(local_1f0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_218);
  res.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._4_4_ =
       2;
  Eigen::operator*(&local_390,
                   (int *)((long)res.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + 0x14),(StorageBaseType *)local_a0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_368,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_390,(type *)0x0);
  mnf::Manifold::createPoint(local_340);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_368);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_3b0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_3b0);
  mnf::Point::pseudoLog((Point *)&local_3c0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_3c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_3c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d0,0x70,&local_3e0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-
              (&local_408,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0);
    local_410 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::
            isApprox<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_3b0,
                       (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_408,&local_410);
    boost::test_tools::assertion_result::assertion_result(&local_3f8,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,"res.isApprox(-v)",0x10);
    boost::unit_test::operator<<(&local_430,prev,&local_440);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::test_tools::tt_detail::report_assertion(&local_3f8,&local_430,&local_450,0x70,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_430);
    boost::test_tools::assertion_result::~assertion_result(&local_3f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::Point::~Point((Point *)local_340);
  mnf::Point::~Point((Point *)local_1f0);
  mnf::RealSpace::~RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.createPoint(v);
  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;
  res.setZero();
  res = y.pseudoLog(x);
  BOOST_CHECK(res.isApprox(-v));
}